

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_lock_posix.cc
# Opt level: O3

RWLockPosix * webrtc::RWLockPosix::Create(void)

{
  int iVar1;
  RWLockPosix *pRVar2;
  
  pRVar2 = (RWLockPosix *)operator_new(0x40);
  (pRVar2->super_RWLockWrapper)._vptr_RWLockWrapper = (_func_int **)&PTR__RWLockPosix_001d1c40;
  (pRVar2->lock_).__align = 0;
  *(undefined8 *)((long)&pRVar2->lock_ + 8) = 0;
  *(undefined8 *)((long)&pRVar2->lock_ + 0x10) = 0;
  *(undefined8 *)((long)&pRVar2->lock_ + 0x18) = 0;
  *(undefined8 *)((long)&pRVar2->lock_ + 0x20) = 0;
  (pRVar2->lock_).__data.__pad2 = 0;
  *(undefined8 *)((long)&pRVar2->lock_ + 0x30) = 0;
  iVar1 = pthread_rwlock_init((pthread_rwlock_t *)&pRVar2->lock_,(pthread_rwlockattr_t *)0x0);
  if (iVar1 != 0) {
    (*(pRVar2->super_RWLockWrapper)._vptr_RWLockWrapper[1])(pRVar2);
    pRVar2 = (RWLockPosix *)0x0;
  }
  return pRVar2;
}

Assistant:

RWLockPosix* RWLockPosix::Create() {
  RWLockPosix* ret_val = new RWLockPosix();
  if (!ret_val->Init()) {
    delete ret_val;
    return NULL;
  }
  return ret_val;
}